

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lyd_parser_notif_eventtime_validate(lyd_node *node)

{
  uint64_t schema_00;
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  ulong local_1178;
  ly_err_item *local_1158;
  ly_ctx *local_1130;
  ly_ctx *local_1128;
  ly_ctx *local_1120;
  ulong local_1118;
  uint64_t c__;
  LY_ERR ret__;
  char *value;
  lysc_pattern **patterns;
  lysp_type *type_p;
  ly_err_item *err;
  uint64_t u;
  lysc_node *schema;
  lys_module *mod2;
  lys_module *mod1;
  lysc_ctx cctx;
  ly_ctx *ctx;
  LY_ERR rc;
  lyd_node *node_local;
  
  ctx._4_4_ = LY_SUCCESS;
  if (node->schema == (lysc_node *)0x0) {
    local_1120 = (ly_ctx *)node[2].schema;
  }
  else {
    local_1120 = node->schema->module->ctx;
  }
  cctx._4248_8_ = local_1120;
  memset(&mod1,0,0x10a0);
  type_p = (lysp_type *)0x0;
  patterns = (lysc_pattern **)0x0;
  value = (char *)0x0;
  mod2 = ly_ctx_get_module_implemented((ly_ctx *)cctx._4248_8_,"notifications");
  schema = (lysc_node *)ly_ctx_get_module_latest((ly_ctx *)cctx._4248_8_,"ietf-yang-types");
  if ((lys_module *)schema == (lys_module *)0x0) {
    __assert_fail("mod2",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x57,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
  }
  if ((mod2 == (lys_module *)0x0) && (((lys_module *)schema)->parsed != (lysp_module *)0x0)) {
    mod1 = (lys_module *)cctx._4248_8_;
    cctx.unres._0_4_ = 1;
    cctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
    cctx._136_8_ = cctx._4248_8_;
    err = (ly_err_item *)0x0;
    while( true ) {
      if (*(long *)(*(long *)(schema + 1) + 0x38) == 0) {
        local_1158 = (ly_err_item *)0x0;
      }
      else {
        local_1158 = *(ly_err_item **)(*(long *)(*(long *)(schema + 1) + 0x38) + -8);
      }
      if (local_1158 <= err) goto LAB_001a748b;
      iVar2 = strcmp(*(char **)(*(long *)(*(long *)(schema + 1) + 0x38) + (long)err * 0xb0),
                     "date-and-time");
      if (iVar2 == 0) break;
      err = (ly_err_item *)((long)&err->level + 1);
    }
    patterns = (lysc_pattern **)(*(long *)(*(long *)(schema + 1) + 0x38) + (long)err * 0xb0 + 0x40);
LAB_001a748b:
    if (patterns == (lysc_pattern **)0x0) {
      __assert_fail("type_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                    ,0x6b,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
    }
    if (patterns[3] == (lysc_pattern *)0x0) {
      __assert_fail("type_p->patterns",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                    ,0x6e,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
    }
    ctx._4_4_ = lys_compile_type_patterns
                          ((lysc_ctx *)&mod1,(lysp_restr *)patterns[3],(lysc_pattern **)0x0,
                           (lysc_pattern ***)&value);
    if (ctx._4_4_ == LY_SUCCESS) {
      __s = lyd_get_value(node);
      pcVar3 = value;
      sVar4 = strlen(__s);
      ctx._4_4_ = lyplg_type_validate_patterns
                            ((lysc_pattern **)pcVar3,__s,sVar4,(ly_err_item **)&type_p);
    }
  }
  else {
    if (node->schema == (lysc_node *)0x0) {
      local_1128 = (ly_ctx *)node[2].schema;
    }
    else {
      local_1128 = node->schema->module->ctx;
    }
    u = (uint64_t)
        lys_find_path(local_1128,(lysc_node *)0x0,"/notifications:notification/eventTime",'\0');
    if ((lysc_node *)u == (lysc_node *)0x0) {
      return LY_ENOTFOUND;
    }
    pcVar3 = lyd_get_value(node);
    schema_00 = u;
    if (node->schema == (lysc_node *)0x0) {
      local_1130 = (ly_ctx *)node[2].schema;
    }
    else {
      local_1130 = node->schema->module->ctx;
    }
    sVar4 = strlen(pcVar3);
    LVar1 = lyd_value_validate(local_1130,(lysc_node *)schema_00,pcVar3,sVar4,(lyd_node *)0x0,
                               (lysc_type **)0x0,(char **)0x0);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
  }
  local_1118 = 0;
  while( true ) {
    if (value == (char *)0x0) {
      local_1178 = 0;
    }
    else {
      local_1178 = *(ulong *)(value + -8);
    }
    if (local_1178 <= local_1118) break;
    lysc_pattern_free((lysf_ctx *)&cctx.path_len,(lysc_pattern **)(value + local_1118 * 8));
    local_1118 = local_1118 + 1;
  }
  if (value != (char *)0x0) {
    free(value + -8);
  }
  if ((ctx._4_4_ != LY_SUCCESS) && (type_p != (lysp_type *)0x0)) {
    ly_err_print((ly_ctx *)cctx._4248_8_,(ly_err_item *)type_p);
    ly_err_free(type_p);
    ly_vlog((ly_ctx *)cctx._4248_8_,(char *)0x0,LYVE_DATA,
            "Invalid \"eventTime\" in the notification.");
  }
  return ctx._4_4_;
}

Assistant:

LY_ERR
lyd_parser_notif_eventtime_validate(const struct lyd_node *node)
{
    LY_ERR rc = LY_SUCCESS;
    struct ly_ctx *ctx = (struct ly_ctx *)LYD_CTX(node);
    struct lysc_ctx cctx = {0};
    const struct lys_module *mod1, *mod2;
    const struct lysc_node *schema;
    LY_ARRAY_COUNT_TYPE u;
    struct ly_err_item *err = NULL;
    struct lysp_type *type_p = NULL;
    struct lysc_pattern **patterns = NULL;
    const char *value;

    /* find the used modules, we will either use a compiled leaf or compile the relevant type ourselves */
    mod1 = ly_ctx_get_module_implemented(ctx, "notifications");
    mod2 = ly_ctx_get_module_latest(ctx, "ietf-yang-types");
    assert(mod2);

    if (mod1 || !mod2->parsed) {
        /* get date-and-time leaf */
        schema = lys_find_path(LYD_CTX(node), NULL, "/notifications:notification/eventTime", 0);
        LY_CHECK_RET(!schema, LY_ENOTFOUND);

        /* validate the value */
        value = lyd_get_value(node);
        LY_CHECK_RET(lyd_value_validate(LYD_CTX(node), schema, value, strlen(value), NULL, NULL, NULL));
    } else {
        LYSC_CTX_INIT_CTX(cctx, ctx);

        /* get date-and-time parsed type */
        LY_ARRAY_FOR(mod2->parsed->typedefs, u) {
            if (!strcmp(mod2->parsed->typedefs[u].name, "date-and-time")) {
                type_p = &mod2->parsed->typedefs[u].type;
                break;
            }
        }
        assert(type_p);

        /* compile patterns */
        assert(type_p->patterns);
        LY_CHECK_GOTO(rc = lys_compile_type_patterns(&cctx, type_p->patterns, NULL, &patterns), cleanup);

        /* validate */
        value = lyd_get_value(node);
        rc = lyplg_type_validate_patterns(patterns, value, strlen(value), &err);
    }

cleanup:
    FREE_ARRAY(&cctx.free_ctx, patterns, lysc_pattern_free);
    if (rc && err) {
        ly_err_print(ctx, err);
        ly_err_free(err);
        LOGVAL(ctx, LYVE_DATA, "Invalid \"eventTime\" in the notification.");
    }
    return rc;
}